

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

stbtt__active_edge *
stbtt__new_active(stbtt__hheap *hh,stbtt__edge *e,int off_x,float start_point,void *userdata)

{
  stbtt__active_edge *psVar1;
  float fVar2;
  float local_44;
  float local_40;
  float dxdy;
  stbtt__active_edge *z;
  void *userdata_local;
  float start_point_local;
  int off_x_local;
  stbtt__edge *e_local;
  stbtt__hheap *hh_local;
  
  psVar1 = (stbtt__active_edge *)stbtt__hheap_alloc(hh,0x20,userdata);
  fVar2 = (e->x1 - e->x0) / (e->y1 - e->y0);
  if (psVar1 == (stbtt__active_edge *)0x0) {
    __assert_fail("z != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                  ,0xabf,
                  "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                 );
  }
  if (psVar1 != (stbtt__active_edge *)0x0) {
    psVar1->fdx = fVar2;
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      local_40 = 1.0 / fVar2;
    }
    else {
      local_40 = 0.0;
    }
    psVar1->fdy = local_40;
    psVar1->fx = fVar2 * (start_point - e->y0) + e->x0;
    psVar1->fx = psVar1->fx - (float)off_x;
    local_44 = 1.0;
    if (e->invert == 0) {
      local_44 = -1.0;
    }
    psVar1->direction = local_44;
    psVar1->sy = e->y0;
    psVar1->ey = e->y1;
    psVar1->next = (stbtt__active_edge *)0x0;
  }
  return psVar1;
}

Assistant:

static stbtt__active_edge *stbtt__new_active(stbtt__hheap *hh, stbtt__edge *e, int off_x, float start_point, void *userdata)
{
   stbtt__active_edge *z = (stbtt__active_edge *) stbtt__hheap_alloc(hh, sizeof(*z), userdata);
   float dxdy = (e->x1 - e->x0) / (e->y1 - e->y0);
   STBTT_assert(z != NULL);
   //STBTT_assert(e->y0 <= start_point);
   if (!z) return z;
   z->fdx = dxdy;
   z->fdy = dxdy != 0.0f ? (1.0f/dxdy) : 0.0f;
   z->fx = e->x0 + dxdy * (start_point - e->y0);
   z->fx -= off_x;
   z->direction = e->invert ? 1.0f : -1.0f;
   z->sy = e->y0;
   z->ey = e->y1;
   z->next = 0;
   return z;
}